

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

AssertionExpr *
slang::ast::BinaryAssertionExpr::fromSyntax(BinarySequenceExprSyntax *syntax,ASTContext *context)

{
  SyntaxKind SVar1;
  Scope *pSVar2;
  SequenceExprSyntax *pSVar3;
  Compilation *this;
  SyntaxNode *this_00;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Diagnostic *this_02;
  BinaryAssertionExpr *pBVar5;
  logic_error *this_03;
  long *plVar6;
  char *func;
  size_type *psVar7;
  long *plVar8;
  anon_class_8_1_898e4d05 check;
  SourceRange SVar9;
  BinaryAssertionOperator op;
  BinaryAssertionOperator local_f4;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  AssertionExpr *this_01;
  
  pSVar2 = (context->scope).ptr;
  if (pSVar2 == (Scope *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
    goto LAB_0039af50;
  }
  pSVar3 = (syntax->left).ptr;
  if (pSVar3 != (SequenceExprSyntax *)0x0) {
    this = pSVar2->compilation;
    iVar4 = AssertionExpr::bind((int)pSVar3,(sockaddr *)context,0);
    this_01 = (AssertionExpr *)CONCAT44(extraout_var,iVar4);
    pSVar3 = (syntax->right).ptr;
    if (pSVar3 != (SequenceExprSyntax *)0x0) {
      iVar4 = AssertionExpr::bind((int)pSVar3,(sockaddr *)context,0);
      SVar1 = (syntax->super_SequenceExprSyntax).super_SyntaxNode.kind;
      if ((int)SVar1 < 0x141) {
        if (SVar1 == AndSequenceExpr) {
          local_f4 = And;
        }
        else {
          if (SVar1 != IntersectSequenceExpr) {
LAB_0039af5a:
            this_03 = (logic_error *)__cxa_allocate_exception(0x10);
            local_d0[0] = local_c0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssertionExpr.cpp"
                       ,"");
            plVar6 = (long *)std::__cxx11::string::append((char *)local_d0);
            local_b0._M_dataplus._M_p = (pointer)*plVar6;
            psVar7 = (size_type *)(plVar6 + 2);
            if ((size_type *)local_b0._M_dataplus._M_p == psVar7) {
              local_b0.field_2._M_allocated_capacity = *psVar7;
              local_b0.field_2._8_8_ = plVar6[3];
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar7;
            }
            local_b0._M_string_length = plVar6[1];
            *plVar6 = (long)psVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::to_string(&local_70,0x34a);
            std::operator+(&local_50,&local_b0,&local_70);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_90 = (long *)*plVar6;
            plVar8 = plVar6 + 2;
            if (local_90 == plVar8) {
              local_80 = *plVar8;
              lStack_78 = plVar6[3];
              local_90 = &local_80;
            }
            else {
              local_80 = *plVar8;
            }
            local_88 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
            local_f0 = (long *)*plVar6;
            plVar8 = plVar6 + 2;
            if (local_f0 == plVar8) {
              local_e0 = *plVar8;
              lStack_d8 = plVar6[3];
              local_f0 = &local_e0;
            }
            else {
              local_e0 = *plVar8;
            }
            local_e8 = plVar6[1];
            *plVar6 = (long)plVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::logic_error::logic_error(this_03,(string *)&local_f0);
            __cxa_throw(this_03,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          local_f4 = Intersect;
        }
      }
      else if (SVar1 == OrSequenceExpr) {
        local_f4 = Or;
      }
      else {
        if (SVar1 == ThroughoutSequenceExpr) {
          local_f4 = Throughout;
          if (((this_01->kind == Simple) && (*(char *)&this_01[2].syntax == '\0')) &&
             (**(int **)(this_01 + 1) != 0x27)) goto LAB_0039aeef;
          this_00 = &((syntax->left).ptr)->super_SyntaxNode;
          if (this_00 != (SyntaxNode *)0x0) {
            SVar9 = slang::syntax::SyntaxNode::sourceRange(this_00);
            this_02 = ASTContext::addDiag(context,(DiagCode)0x450008,SVar9);
            SVar9 = parsing::Token::range(&syntax->op);
            Diagnostic::operator<<(this_02,SVar9);
            goto LAB_0039aeef;
          }
          goto LAB_0039af24;
        }
        if (SVar1 != WithinSequenceExpr) goto LAB_0039af5a;
        local_f4 = Within;
      }
      AssertionExpr::requireSequence(this_01,context,(DiagCode)0x300008);
LAB_0039aeef:
      AssertionExpr::requireSequence
                ((AssertionExpr *)CONCAT44(extraout_var_00,iVar4),context,(DiagCode)0x300008);
      pBVar5 = BumpAllocator::
               emplace<slang::ast::BinaryAssertionExpr,slang::ast::BinaryAssertionOperator&,slang::ast::AssertionExpr_const&,slang::ast::AssertionExpr_const&>
                         (&this->super_BumpAllocator,&local_f4,this_01,
                          (AssertionExpr *)CONCAT44(extraout_var_00,iVar4));
      return &pBVar5->super_AssertionExpr;
    }
  }
LAB_0039af24:
  func = 
  "T slang::not_null<slang::syntax::SequenceExprSyntax *>::get() const [T = slang::syntax::SequenceExprSyntax *]"
  ;
LAB_0039af50:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

bool visitInvalid(const AssertionExpr&) { return false; }